

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O2

bool LTACMasterdataChannel::PassOnRequest(LTACMasterdataChannel *pChn,acStatUpdateTy *requ)

{
  _List_node_base *p_Var1;
  char cVar2;
  _List_iterator<LTACMasterdataChannel_*> _Var3;
  LTACMasterdataChannel *pChn_local;
  
  pChn_local = pChn;
  std::recursive_mutex::lock(&mtxMaster);
  p_Var1 = lstChn_abi_cxx11_.
           super__List_base<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (pChn != (LTACMasterdataChannel *)0x0) {
    _Var3 = std::
            __find_if<std::_List_iterator<LTACMasterdataChannel*>,__gnu_cxx::__ops::_Iter_equals_val<LTACMasterdataChannel*const>>
                      (lstChn_abi_cxx11_.
                       super__List_base<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>
                       ._M_impl._M_node.super__List_node_base._M_next,&lstChn_abi_cxx11_,&pChn_local
                      );
    p_Var1 = (_List_node_base *)&lstChn_abi_cxx11_;
    if (_Var3._M_node != (_List_node_base *)&lstChn_abi_cxx11_) goto LAB_00155d24;
  }
  while( true ) {
    _Var3._M_node = p_Var1;
    if (_Var3._M_node == (_List_node_base *)&lstChn_abi_cxx11_) {
      pthread_mutex_unlock((pthread_mutex_t *)&mtxMaster);
      return false;
    }
    p_Var1 = _Var3._M_node[1]._M_next;
    cVar2 = (*(code *)p_Var1->_M_next[5]._M_next)(p_Var1);
    if ((cVar2 != '\0') &&
       (cVar2 = (*(code *)p_Var1->_M_next[0xb]._M_next)(p_Var1,requ), cVar2 != '\0')) break;
LAB_00155d24:
    p_Var1 = (((_List_base<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_> *)
              &(_Var3._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&mtxMaster);
  return true;
}

Assistant:

bool LTACMasterdataChannel::PassOnRequest (LTACMasterdataChannel* pChn, const acStatUpdateTy& requ)
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        auto iter = lstChn.begin();
        if (pChn) {                                 // if channel passed in find _next_ channel
            iter = std::find(lstChn.begin(), lstChn.end(), pChn);
            if (iter != lstChn.end()) ++iter;
        }
        // Loop to find a channel, which accepts
        for (;iter != lstChn.end(); ++iter) {
            LTACMasterdataChannel& ch = *(*iter);
            if (ch.IsEnabled() &&
                ch.AcceptRequest(requ))
                return true;
        }

    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
    return false;
}